

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmPostModify(ExpressionContext *ctx,VmModule *module,ExprPostModify *node)

{
  SynBase *pSVar1;
  bool bVar2;
  VmValue *pVVar3;
  TypeRef *pTVar4;
  VmValue *lhs;
  VmConstant *pVVar5;
  int value_00;
  longlong value_01;
  double local_60;
  VmValue *result;
  VmValue *value;
  TypeRef *refType;
  VmValue *address;
  ExprPostModify *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  pVVar3 = CompileVm(ctx,module,node->value);
  pTVar4 = getType<TypeRef>(node->value->type);
  if (pTVar4 == (TypeRef *)0x0) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xa70,
                  "VmValue *CompileVmPostModify(ExpressionContext &, VmModule *, ExprPostModify *)")
    ;
  }
  lhs = anon_unknown.dwarf_c91b1::CreateLoad
                  (ctx,module,(node->super_ExprBase).source,pTVar4->subType,pVVar3,0);
  bVar2 = VmType::operator==(&lhs->type,&VmType::Int);
  if (bVar2) {
    pSVar1 = (node->super_ExprBase).source;
    value_00 = -1;
    if ((node->isIncrement & 1U) != 0) {
      value_00 = 1;
    }
    pVVar5 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,value_00);
    result = anon_unknown.dwarf_c91b1::CreateAdd(module,pSVar1,lhs,&pVVar5->super_VmValue);
  }
  else {
    bVar2 = VmType::operator==(&lhs->type,&VmType::Double);
    if (bVar2) {
      pSVar1 = (node->super_ExprBase).source;
      local_60 = 1.0;
      if ((node->isIncrement & 1U) == 0) {
        local_60 = -1.0;
      }
      pVVar5 = CreateConstantDouble(module->allocator,(node->super_ExprBase).source,local_60);
      result = anon_unknown.dwarf_c91b1::CreateAdd(module,pSVar1,lhs,&pVVar5->super_VmValue);
    }
    else {
      bVar2 = VmType::operator==(&lhs->type,&VmType::Long);
      result = lhs;
      if (bVar2) {
        pSVar1 = (node->super_ExprBase).source;
        value_01 = -1;
        if ((node->isIncrement & 1U) != 0) {
          value_01 = 1;
        }
        pVVar5 = CreateConstantLong(module->allocator,(node->super_ExprBase).source,value_01);
        result = anon_unknown.dwarf_c91b1::CreateAdd(module,pSVar1,lhs,&pVVar5->super_VmValue);
      }
    }
  }
  anon_unknown.dwarf_c91b1::CreateStore
            (ctx,module,(node->super_ExprBase).source,pTVar4->subType,pVVar3,result,0);
  pVVar3 = anon_unknown.dwarf_c91b1::CheckType(ctx,&node->super_ExprBase,lhs);
  return pVVar3;
}

Assistant:

VmValue* CompileVmPostModify(ExpressionContext &ctx, VmModule *module, ExprPostModify *node)
{
	VmValue *address = CompileVm(ctx, module, node->value);

	TypeRef *refType = getType<TypeRef>(node->value->type);

	assert(refType);

	VmValue *value = CreateLoad(ctx, module, node->source, refType->subType, address, 0);
	VmValue *result = value;

	if(value->type == VmType::Int)
		value = CreateAdd(module, node->source, value, CreateConstantInt(module->allocator, node->source, node->isIncrement ? 1 : -1));
	else if(value->type == VmType::Double)
		value = CreateAdd(module, node->source, value, CreateConstantDouble(module->allocator, node->source, node->isIncrement ? 1.0 : -1.0));
	else if(value->type == VmType::Long)
		value = CreateAdd(module, node->source, value, CreateConstantLong(module->allocator, node->source, node->isIncrement ? 1ll : -1ll));
	else
		assert("!unknown type");

	CreateStore(ctx, module, node->source, refType->subType, address, value, 0);

	return CheckType(ctx, node, result);
}